

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paex_mono_asio_channel_select.c
# Opt level: O2

int patestCallback(void *inputBuffer,void *outputBuffer,unsigned_long framesPerBuffer,
                  PaStreamCallbackTimeInfo *timeInfo,PaStreamCallbackFlags statusFlags,
                  void *userData)

{
  int iVar1;
  unsigned_long i;
  float *out;
  int iVar2;
  
  for (i = 0; framesPerBuffer != i; i = i + 1) {
    iVar1 = *(int *)((long)userData + 800);
    *(undefined4 *)((long)outputBuffer + i * 4) = *(undefined4 *)((long)userData + (long)iVar1 * 4);
    iVar2 = iVar1 + -199;
    if ((long)iVar1 < 199) {
      iVar2 = iVar1 + 1;
    }
    *(int *)((long)userData + 800) = iVar2;
  }
  return 0;
}

Assistant:

static int patestCallback( const void *inputBuffer, void *outputBuffer,
                            unsigned long framesPerBuffer,
                            const PaStreamCallbackTimeInfo* timeInfo,
                            PaStreamCallbackFlags statusFlags,
                            void *userData )
{
    paTestData *data = (paTestData*)userData;
    float *out = (float*)outputBuffer;
    unsigned long i;
    int finished = 0;
    /* avoid unused variable warnings */
    (void) inputBuffer;
    (void) timeInfo;
    (void) statusFlags;
    for( i=0; i<framesPerBuffer; i++ )
    {
        *out++ = data->sine[data->phase];  /* left */
        data->phase += 1;
        if( data->phase >= TABLE_SIZE ) data->phase -= TABLE_SIZE;
    }
    return finished;
}